

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lib.c
# Opt level: O2

int main(void)

{
  int iVar1;
  ulp_ring_private_key *r_priv_key;
  ulp_ring_public_key *r_pub_key;
  uint8_t *decrypted;
  ulp_ciphertext *ciphertext;
  ulp_private_key *priv_key;
  ulp_public_key *pub_key;
  uint8_t *r_decrypted;
  ulp_ring_ciphertext *r_ciphertext;
  uint64_t q;
  uint64_t se;
  uint64_t sk;
  uint8_t msg [12];
  
  ulp_generate_parameters(0xc0,0x60,&sk,&se,&q);
  ulp_generate_key_pair(0xc0,0x60,sk,se,q,&pub_key,&priv_key);
  builtin_memcpy(msg,"Hello World!",0xc);
  ulp_encrypt(msg,pub_key,&ciphertext);
  ulp_decrypt(ciphertext,priv_key,&decrypted);
  iVar1 = bcmp(msg,decrypted,0xc);
  if (iVar1 == 0) {
    sk = 0x8673;
    se = 0x52892b;
    q = 0x1a9c290b0d397;
    ulp_ring_generate_key_pair(0x60,0x8673,0x52892b,0x1a9c290b0d397,&r_pub_key,&r_priv_key);
    ulp_ring_encrypt(msg,r_pub_key,&r_ciphertext);
    ulp_ring_decrypt(r_ciphertext,r_priv_key,&r_decrypted);
    iVar1 = bcmp(msg,r_decrypted,0xc);
    if (iVar1 == 0) {
      ulp_free_public_key(pub_key);
      ulp_free_private_key(priv_key);
      ulp_free_ciphertext(ciphertext);
      free(decrypted);
      ulp_ring_free_public_key(r_pub_key);
      ulp_ring_free_private_key(r_priv_key);
      iVar1 = 0;
      goto LAB_0010133b;
    }
  }
  ulp_free_public_key(pub_key);
  ulp_free_private_key(priv_key);
  ulp_free_ciphertext(ciphertext);
  free(decrypted);
  ulp_ring_free_public_key(r_pub_key);
  ulp_ring_free_private_key(r_priv_key);
  iVar1 = 1;
LAB_0010133b:
  ulp_ring_free_ciphertext(r_ciphertext);
  free(r_decrypted);
  return iVar1;
}

Assistant:

int main() {

    // test U-LP functions for normal variant

    size_t n = 192;
    size_t l = 96;
    uint64_t sk;
    uint64_t se;
    uint64_t q;

    ulp_generate_parameters(n, l, &sk, &se, &q);

    ulp_public_key* pub_key;
    ulp_private_key* priv_key;
    ulp_generate_key_pair(n, l, sk, se, q, &pub_key, &priv_key);

    uint8_t msg[] = {'H', 'e', 'l', 'l', 'o', ' ', 'W', 'o', 'r', 'l', 'd', '!'};

    ulp_ciphertext* ciphertext;
    ulp_encrypt(msg, pub_key, &ciphertext);

    uint8_t* decrypted;
    ulp_decrypt(ciphertext, priv_key, &decrypted);

    if(memcmp(msg, decrypted, l/8) != 0)
        goto error;


    // test U-LP functions for ring variant

    n = 96;
    sk = 34419;
    se = 5409067;
    q = 468128092967831;

    ulp_ring_public_key* r_pub_key;
    ulp_ring_private_key* r_priv_key;
    ulp_ring_generate_key_pair(n, sk, se, q, &r_pub_key, &r_priv_key);

    ulp_ring_ciphertext* r_ciphertext;
    ulp_ring_encrypt(msg, r_pub_key, &r_ciphertext);

    uint8_t* r_decrypted;
    ulp_ring_decrypt(r_ciphertext, r_priv_key, &r_decrypted);

    if(memcmp(msg, r_decrypted, n/8) != 0)
        goto error;


    // do cleanup

    ulp_free_public_key(pub_key);
    ulp_free_private_key(priv_key);
    ulp_free_ciphertext(ciphertext);
    free(decrypted);
    ulp_ring_free_public_key(r_pub_key);
    ulp_ring_free_private_key(r_priv_key);
    ulp_ring_free_ciphertext(r_ciphertext);
    free(r_decrypted);
    return 0;


    error:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        ulp_free_ciphertext(ciphertext);
        free(decrypted);
        ulp_ring_free_public_key(r_pub_key);
        ulp_ring_free_private_key(r_priv_key);
        ulp_ring_free_ciphertext(r_ciphertext);
        free(r_decrypted);
        return 1;

}